

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_version.c
# Opt level: O2

void test_option_version(void)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  wchar_t wVar4;
  char *_v1;
  ushort **ppuVar5;
  char *pcVar6;
  char *_v2;
  char *e2;
  long lVar7;
  long lVar8;
  size_t sVar9;
  char *ld;
  size_t s;
  
  wVar4 = systemf("%s --version >version.stdout 2>version.stderr",testprog);
  if (wVar4 == L'\0') {
    wVar4 = L'\x01';
  }
  else {
    wVar4 = systemf("%s -W version >version.stdout 2>version.stderr",testprog);
    wVar4 = (wchar_t)(wVar4 == L'\0');
  }
  failure("Unable to run either %s --version or %s -W version",testprog);
  wVar4 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                           ,L'i',wVar4,"r == 0",(void *)0x0);
  if (wVar4 == L'\0') {
    return;
  }
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
             ,L'm',"version.stderr");
  _v1 = slurpfile(&s,"version.stdout");
  failure("version message too short:",_v1);
  wVar4 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                           ,L'\'',(uint)(6 < s),"s > 6",(void *)0x0);
  if (wVar4 != L'\0') {
    failure("Version message should begin with \'bsdcpio\': %s",_v1);
    wVar4 = assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                                ,L'*',_v1,"q","bsdcpio ","\"bsdcpio \"",8,"8",(void *)0x0);
    if (wVar4 != L'\0') {
      for (lVar8 = 0; sVar9 = s, s - 8 != lVar8; lVar8 = lVar8 + 1) {
        if (_v1[lVar8 + 8] != '.' && 9 < (byte)(_v1[lVar8 + 8] - 0x30U)) {
          sVar9 = lVar8 + 8;
          break;
        }
      }
      failure("Version: %s",_v1);
      lVar8 = s - lVar8;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                       ,L'5',(uint)(1 < lVar8 - 8U),"s > 1",(void *)0x0);
      pcVar6 = _v1 + sVar9 + ((byte)(_v1[sVar9] + 0x9fU) < 4);
      failure("Version: %s",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                       ,L':',(uint)(*pcVar6 == ' '),"*q == \' \'",(void *)0x0);
      failure("Version: %s",_v1);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                          ,L'>',pcVar6 + 1,"q","-- ","\"-- \"",3,"3",(void *)0x0);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                       ,L'A',(uint)(lVar8 - 0x18U < 0xfffffffffffffff4),"s > 11",(void *)0x0);
      failure("Version: %s",_v1);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                          ,L'C',pcVar6 + 4,"q","libarchive ","\"libarchive \"",0xb,"11",(void *)0x0)
      ;
      pcVar6 = pcVar6 + 0x10;
      lVar8 = lVar8 + -0x17;
      while( true ) {
        cVar2 = pcVar6[-1];
        if ((lVar8 == 0) || (cVar2 != '.' && 9 < (byte)(cVar2 - 0x30U))) break;
        pcVar6 = pcVar6 + 1;
        lVar8 = lVar8 + -1;
      }
      for (lVar7 = 0; lVar1 = (ulong)((byte)(cVar2 + 0x9fU) < 4) + lVar7, lVar8 != lVar7;
          lVar7 = lVar7 + 1) {
        bVar3 = pcVar6[lVar1 + -1];
        if (((0x2f < (ulong)bVar3) || ((0xc00100000000U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) &&
           (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(char)bVar3] & 8) == 0)) break;
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                       ,L'S',(uint)(lVar8 != lVar7),"s >= 1",(void *)0x0);
      failure("Version: %s",_v1);
      if (pcVar6[lVar1 + -1] == '\r') {
        if (pcVar6[lVar1] == '\0') goto LAB_0010f56f;
        _v2 = "\r\n";
        e2 = "\"\\x0d\\x0a\"";
        wVar4 = L'W';
        ld = "2";
        sVar9 = 2;
      }
      else {
        _v2 = "\n";
        e2 = "\"\\x0a\"";
        wVar4 = L'Y';
        ld = "1";
        sVar9 = 1;
      }
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                          ,wVar4,pcVar6 + lVar1 + -1,"q",_v2,e2,sVar9,ld,(void *)0x0);
    }
  }
LAB_0010f56f:
  free(_v1);
  return;
}

Assistant:

DEFINE_TEST(test_option_version)
{
	int r;
	char *p;
	size_t s;

	r = systemf("%s --version >version.stdout 2>version.stderr", testprog);
	if (r != 0)
		r = systemf("%s -W version >version.stdout 2>version.stderr",
		    testprog);
	failure("Unable to run either %s --version or %s -W version",
	    testprog, testprog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stderr. */
	assertEmptyFile("version.stderr");
	/* Verify format of version message. */
	p = slurpfile(&s, "version.stdout");
	verify(p, s);
	free(p);
}